

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O1

void __thiscall
absl::lts_20240722::str_format_internal::BufferRawSink::Write(BufferRawSink *this,string_view v)

{
  ulong uVar1;
  ulong __n;
  
  uVar1 = v._M_len;
  __n = this->size_;
  if (uVar1 <= this->size_) {
    __n = uVar1;
  }
  memcpy(this->buffer_,v._M_str,__n);
  this->buffer_ = this->buffer_ + __n;
  this->size_ = this->size_ - __n;
  this->total_written_ = this->total_written_ + uVar1;
  return;
}

Assistant:

void BufferRawSink::Write(string_view v) {
  size_t to_write = std::min(v.size(), size_);
  std::memcpy(buffer_, v.data(), to_write);
  buffer_ += to_write;
  size_ -= to_write;
  total_written_ += v.size();
}